

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QList<QString>>>(QDataStream *s,QList<QList<QString>_> *c)

{
  QDataStream QVar1;
  char cVar2;
  Data *asize;
  long in_FS_OFFSET;
  quint32 first;
  QArrayDataPointer<QString> local_58;
  uint local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar2 = QDataStream::isDeviceTransactionStarted();
  if (cVar2 == '\0') {
    QDataStream::resetStatus();
  }
  QList<QList<QString>_>::clear(c);
  local_34 = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_34);
  asize = (Data *)(ulong)local_34;
  if (asize == (Data *)0xfffffffe) {
    if (0x15 < *(int *)(s + 0x18)) {
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(longlong *)&local_58);
      asize = local_58.d;
      if ((long)local_58.d < 0) goto LAB_0063eadb;
    }
  }
  else if (local_34 == 0xffffffff) {
LAB_0063eadb:
    QDataStream::setStatus((Status)s);
    goto LAB_0063eb80;
  }
  QList<QList<QString>_>::reserve(c,(qsizetype)asize);
  for (; asize != (Data *)0x0; asize = (Data *)((long)&asize[-1].super_QArrayData.alloc + 7)) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_58.size = 0;
    readArrayBasedContainer<QList<QString>>(s,(QList<QString> *)&local_58);
    if (s[0x13] != (QDataStream)0x0) {
      QList<QList<QString>_>::clear(c);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
      break;
    }
    QMovableArrayOps<QList<QString>>::emplace<QList<QString>const&>
              ((QMovableArrayOps<QList<QString>> *)c,(c->d).size,(QList<QString> *)&local_58);
    QList<QList<QString>_>::end(c);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
LAB_0063eb80:
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}